

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_engine.hpp
# Opt level: O0

void __thiscall
chaiscript::ChaiScript_Basic::load_module
          (ChaiScript_Basic *this,string *t_module_name,string *t_filename)

{
  size_type sVar1;
  Loadable_Module *this_00;
  mapped_type *this_01;
  element_type *peVar2;
  size_type sVar3;
  __shared_ptr_access<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
  *this_02;
  undefined1 local_48 [8];
  Loadable_Module_Ptr lm;
  lock_guard<std::recursive_mutex> local_28;
  lock_guard<chaiscript::detail::threading::recursive_mutex> l;
  string *t_filename_local;
  string *t_module_name_local;
  ChaiScript_Basic *this_local;
  
  l._M_device = (mutex_type *)t_filename;
  std::lock_guard<std::recursive_mutex>::lock_guard(&local_28,&this->m_use_mutex);
  sVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
          ::count(&this->m_loaded_modules,t_module_name);
  if (sVar1 == 0) {
    this_00 = (Loadable_Module *)operator_new(0x20);
    detail::Loadable_Module::Loadable_Module(this_00,t_module_name,(string *)l._M_device);
    std::shared_ptr<chaiscript::detail::Loadable_Module>::
    shared_ptr<chaiscript::detail::Loadable_Module,void>
              ((shared_ptr<chaiscript::detail::Loadable_Module> *)local_48,this_00);
    this_01 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
              ::operator[](&this->m_loaded_modules,t_module_name);
    std::shared_ptr<chaiscript::detail::Loadable_Module>::operator=
              (this_01,(shared_ptr<chaiscript::detail::Loadable_Module> *)local_48);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::insert(&this->m_active_loaded_modules,t_module_name);
    peVar2 = std::
             __shared_ptr_access<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)local_48);
    add(this,&peVar2->m_moduleptr);
    std::shared_ptr<chaiscript::detail::Loadable_Module>::~shared_ptr
              ((shared_ptr<chaiscript::detail::Loadable_Module> *)local_48);
  }
  else {
    sVar3 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count(&this->m_active_loaded_modules,t_module_name);
    if (sVar3 == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert(&this->m_active_loaded_modules,t_module_name);
      this_02 = (__shared_ptr_access<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 *)std::
                   map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<chaiscript::detail::Loadable_Module>_>_>_>
                   ::operator[](&this->m_loaded_modules,t_module_name);
      peVar2 = std::
               __shared_ptr_access<chaiscript::detail::Loadable_Module,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->(this_02);
      add(this,&peVar2->m_moduleptr);
    }
  }
  std::lock_guard<std::recursive_mutex>::~lock_guard(&local_28);
  return;
}

Assistant:

void load_module(const std::string &t_module_name, const std::string &t_filename) {
      chaiscript::detail::threading::lock_guard<chaiscript::detail::threading::recursive_mutex> l(m_use_mutex);

      if (m_loaded_modules.count(t_module_name) == 0) {
        detail::Loadable_Module_Ptr lm(new detail::Loadable_Module(t_module_name, t_filename));
        m_loaded_modules[t_module_name] = lm;
        m_active_loaded_modules.insert(t_module_name);
        add(lm->m_moduleptr);
      } else if (m_active_loaded_modules.count(t_module_name) == 0) {
        m_active_loaded_modules.insert(t_module_name);
        add(m_loaded_modules[t_module_name]->m_moduleptr);
      }
    }